

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dwarf.cpp
# Opt level: O0

StringRef llvm::dwarf::ChildrenString(uint Children)

{
  undefined1 auStack_18 [4];
  uint Children_local;
  
  if (Children == 0) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_CHILDREN_no");
  }
  else if (Children == 1) {
    StringRef::StringRef((StringRef *)auStack_18,"DW_CHILDREN_yes");
  }
  else {
    memset(auStack_18,0,0x10);
    StringRef::StringRef((StringRef *)auStack_18);
  }
  return _auStack_18;
}

Assistant:

StringRef llvm::dwarf::ChildrenString(unsigned Children) {
  switch (Children) {
  case DW_CHILDREN_no:
    return "DW_CHILDREN_no";
  case DW_CHILDREN_yes:
    return "DW_CHILDREN_yes";
  }
  return StringRef();
}